

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_set_lexicon.h
# Opt level: O2

int32 __thiscall
IdSetLexicon::Add<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (IdSetLexicon *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  pointer piVar1;
  int32 iVar2;
  S2LogMessage local_30;
  
  piVar1 = (this->tmp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->tmp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->tmp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  while( true ) {
    if (begin._M_current == end._M_current) {
      iVar2 = AddInternal(this,&this->tmp_);
      return iVar2;
    }
    if (*begin._M_current < 0) break;
    std::vector<int,_std::allocator<int>_>::push_back(&this->tmp_,begin._M_current);
    begin._M_current = begin._M_current + 1;
  }
  S2LogMessage::S2LogMessage
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/id_set_lexicon.h"
             ,0xbb,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_30.stream_,"Check failed: (*begin) >= (0) ");
  abort();
}

Assistant:

int32 IdSetLexicon::Add(FwdIterator begin, FwdIterator end) {
  tmp_.clear();
  for (; begin != end; ++begin) {
    S2_DCHECK_GE(*begin, 0);
    S2_DCHECK_LE(*begin, std::numeric_limits<int32>::max());
    tmp_.push_back(*begin);
  }
  return AddInternal(&tmp_);
}